

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

UA_UInt16 UA_Server_run_iterate(UA_Server *server,UA_Boolean waitInternal)

{
  UA_ByteString *message;
  RepeatedJob *pRVar1;
  RepeatedJob **ppRVar2;
  RepeatedJob *pRVar3;
  RepeatedJob *pRVar4;
  UA_ServerNetworkLayer *pUVar5;
  undefined1 auVar6 [16];
  UA_UInt16 UVar7;
  UA_StatusCode UVar8;
  long lVar9;
  ulong uVar10;
  size_t sVar11;
  RepeatedJob *pRVar12;
  UA_UInt16 UVar13;
  long lVar14;
  ulong uVar15;
  RepeatedJob *pRVar16;
  RepeatedJob *pRVar17;
  long lVar18;
  size_t sVar19;
  RepeatedJob *local_a8;
  timespec ts;
  UA_Boolean local_31;
  
  clock_gettime(4,(timespec *)&stack0xffffffffffffff58);
  lVar18 = ts.tv_sec / 100 + (long)local_a8 * 10000000;
  pRVar16 = (server->repeatedJobs).lh_first;
  if (pRVar16 == (RepeatedJob *)0x0) {
    lVar9 = lVar18 + 500000;
  }
  else {
    pRVar17 = pRVar16;
    if (lVar18 < pRVar16->nextTime) {
      pRVar12 = (RepeatedJob *)0x0;
    }
    else {
      do {
        pRVar12 = pRVar17;
        pRVar17 = (pRVar12->next).le_next;
        if (pRVar17 == (RepeatedJob *)0x0) break;
      } while (pRVar17->nextTime <= lVar18);
    }
    ts.tv_nsec = lVar18 + -1;
    pRVar17 = (RepeatedJob *)&stack0xffffffffffffff58;
    do {
      if (lVar18 < pRVar16->nextTime) break;
      pRVar1 = (pRVar16->next).le_next;
      ppRVar2 = (pRVar16->next).le_prev;
      processJob(server,&pRVar16->job);
      pRVar3 = pRVar17;
      if (*ppRVar2 == pRVar16) {
        lVar9 = pRVar16->nextTime + pRVar16->interval;
        if (lVar9 < lVar18) {
          lVar9 = lVar18 + 1;
        }
        pRVar16->nextTime = lVar9;
        if (pRVar17->nextTime == lVar9) {
          if (pRVar17 == (RepeatedJob *)&stack0xffffffffffffff58) {
            __assert_fail("last_dispatched != &tmp_last",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jh-isw[P]OpcUaConsoleClient/open62541/open62541.c"
                          ,0x46c4,
                          "UA_DateTime processRepeatedJobs(UA_Server *, UA_DateTime, UA_Boolean *)")
            ;
          }
        }
        else {
          pRVar3 = pRVar12;
          if (pRVar12 == (RepeatedJob *)0x0) {
            __assert_fail("lastNow",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jh-isw[P]OpcUaConsoleClient/open62541/open62541.c"
                          ,0x46c9,
                          "UA_DateTime processRepeatedJobs(UA_Server *, UA_DateTime, UA_Boolean *)")
            ;
          }
          do {
            pRVar17 = pRVar3;
            pRVar3 = (pRVar17->next).le_next;
            if (pRVar3 == (RepeatedJob *)0x0) break;
          } while (pRVar3->nextTime < lVar9);
        }
        pRVar3 = pRVar16;
        if (pRVar17 != pRVar16) {
          pRVar4 = (pRVar16->next).le_next;
          ppRVar2 = (pRVar16->next).le_prev;
          if (pRVar4 != (RepeatedJob *)0x0) {
            (pRVar4->next).le_prev = ppRVar2;
          }
          *ppRVar2 = pRVar4;
          pRVar4 = (pRVar17->next).le_next;
          (pRVar16->next).le_next = pRVar4;
          if (pRVar4 != (RepeatedJob *)0x0) {
            (pRVar4->next).le_prev = (RepeatedJob **)pRVar16;
          }
          (pRVar17->next).le_next = pRVar16;
          (pRVar16->next).le_prev = (RepeatedJob **)pRVar17;
        }
      }
      pRVar17 = pRVar3;
      pRVar16 = pRVar1;
    } while (pRVar1 != (RepeatedJob *)0x0);
    pRVar16 = (server->repeatedJobs).lh_first;
    lVar9 = lVar18 + 500000;
    if ((pRVar16 != (RepeatedJob *)0x0) && (lVar14 = pRVar16->nextTime, lVar14 < lVar9)) {
      lVar9 = lVar14;
    }
  }
  if (waitInternal) {
    auVar6 = SEXT816(lVar9 - lVar18) * SEXT816(0x346dc5d63886594b);
    UVar13 = (short)(auVar6._8_4_ >> 0xb) - (auVar6._14_2_ >> 0xf);
  }
  else {
    UVar13 = 0;
  }
  uVar10 = (server->config).networkLayersSize;
  if (uVar10 != 0) {
    uVar15 = 0;
    do {
      pUVar5 = (server->config).networkLayers;
      local_a8 = (RepeatedJob *)0x0;
      UVar7 = 0;
      if (uVar15 == uVar10 - 1) {
        UVar7 = UVar13;
      }
      sVar11 = (*pUVar5[uVar15].getJobs)(pUVar5 + uVar15,(UA_Job **)&stack0xffffffffffffff58,UVar7);
      if (sVar11 != 0) {
        lVar18 = 0x10;
        sVar19 = sVar11;
        do {
          pRVar16 = local_a8;
          if (*(int *)((long)(&local_a8->id + -3) + lVar18) == 2) {
            local_31 = false;
            message = (UA_ByteString *)
                      ((long)&((RepeatedJob *)
                              (&((RepeatedJob *)(&((RepeatedJob *)(&local_a8->id + -2))->id + -2))->
                                id + -2))->id + lVar18 + 0xffffffffffffffe0U);
            UVar8 = UA_Connection_completeMessages
                              (*(UA_Connection **)((local_a8->id).data4 + lVar18 + -0x30),message,
                               &local_31);
            if (UVar8 == 0) {
              if (local_31 == true) {
                *(undefined4 *)((long)(&pRVar16->id + -3) + lVar18) = 3;
              }
              if (message->length != 0) goto LAB_0011bcd7;
            }
            else if (UVar8 == 0x80030000) {
              UA_LOG_WARNING((server->config).logger,UA_LOGCATEGORY_NETWORK,
                             "Lost message(s) from Connection %i as memory could not be allocated",
                             (ulong)*(uint *)(*(long *)((pRVar16->id).data4 + lVar18 + -0x30) + 0x38
                                             ));
            }
            else {
              UA_LOG_INFO((server->config).logger,UA_LOGCATEGORY_NETWORK,
                          "Could not merge half-received messages on Connection %i with error 0x%08x"
                          ,(ulong)*(uint *)(*(long *)((pRVar16->id).data4 + lVar18 + -0x30) + 0x38),
                          (ulong)UVar8);
            }
            *(undefined4 *)((long)(&pRVar16->id + -3) + lVar18) = 0;
          }
LAB_0011bcd7:
          lVar18 = lVar18 + 0x20;
          sVar19 = sVar19 - 1;
        } while (sVar19 != 0);
        lVar18 = 0;
        do {
          processJob(server,(UA_Job *)
                            ((long)&((RepeatedJob *)
                                    (&((RepeatedJob *)
                                      (&((RepeatedJob *)(&local_a8->id + -2))->id + -2))->id + -2))
                                    ->id + lVar18 + 0xffffffffffffffe0U));
          lVar18 = lVar18 + 0x20;
          sVar11 = sVar11 - 1;
        } while (sVar11 != 0);
        free(local_a8);
      }
      uVar15 = uVar15 + 1;
      uVar10 = (server->config).networkLayersSize;
    } while (uVar15 < uVar10);
  }
  processDelayedCallbacks(server);
  clock_gettime(4,(timespec *)&stack0xffffffffffffff58);
  lVar14 = ts.tv_sec / 100 + (long)local_a8 * 10000000;
  lVar18 = lVar9 - lVar14;
  if (lVar18 == 0 || lVar9 < lVar14) {
    UVar13 = 0;
  }
  else {
    auVar6 = SEXT816(lVar18) * SEXT816(0x346dc5d63886594b);
    UVar13 = (short)(auVar6._8_8_ >> 0xb) - (auVar6._14_2_ >> 0xf);
  }
  return UVar13;
}

Assistant:

UA_UInt16 UA_Server_run_iterate(UA_Server *server, UA_Boolean waitInternal) {
#ifdef UA_ENABLE_MULTITHREADING
    /* Run work assigned for the main thread */
    processMainLoopJobs(server);
#endif
    /* Process repeated work */
    UA_DateTime now = UA_DateTime_nowMonotonic();
    UA_Boolean dispatched = false; /* to wake up worker threads */
    UA_DateTime nextRepeated = processRepeatedJobs(server, now, &dispatched);

    UA_UInt16 timeout = 0;
    if(waitInternal)
        timeout = (UA_UInt16)((nextRepeated - now) / UA_MSEC_TO_DATETIME);

    /* Get work from the networklayer */
    for(size_t i = 0; i < server->config.networkLayersSize; ++i) {
        UA_ServerNetworkLayer *nl = &server->config.networkLayers[i];
        UA_Job *jobs = NULL;
        size_t jobsSize;
        /* only the last networklayer waits on the tieout */
        if(i == server->config.networkLayersSize-1)
            jobsSize = nl->getJobs(nl, &jobs, timeout);
        else
            jobsSize = nl->getJobs(nl, &jobs, 0);

        for(size_t k = 0; k < jobsSize; ++k) {
#ifdef UA_ENABLE_MULTITHREADING
            /* Filter out delayed work */
            if(jobs[k].type == UA_JOBTYPE_METHODCALL_DELAYED) {
                addDelayedJob(server, &jobs[k]);
                jobs[k].type = UA_JOBTYPE_NOTHING;
                continue;
            }
#endif
            /* Merge half-received messages */
            if(jobs[k].type == UA_JOBTYPE_BINARYMESSAGE_NETWORKLAYER)
                completeMessages(server, &jobs[k]);
        }

        /* Dispatch/process jobs */
        for(size_t j = 0; j < jobsSize; ++j) {
#ifdef UA_ENABLE_MULTITHREADING
            dispatchJob(server, &jobs[j]);
            dispatched = true;
#else
            processJob(server, &jobs[j]);
#endif
        }

        /* Clean up jobs list */
        if(jobsSize > 0)
            UA_free(jobs);
    }

#ifdef UA_ENABLE_MULTITHREADING
    /* Wake up worker threads */
    if(dispatched)
        pthread_cond_broadcast(&server->dispatchQueue_condition);
#else
    processDelayedCallbacks(server);
#endif

    now = UA_DateTime_nowMonotonic();
    timeout = 0;
    if(nextRepeated > now)
        timeout = (UA_UInt16)((nextRepeated - now) / UA_MSEC_TO_DATETIME);
    return timeout;
}